

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O2

CubicSplinePtr __thiscall OpenMD::EAMAdapter::getZSpline(EAMAdapter *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  int iVar1;
  EAMAdapter *in_RSI;
  int iVar2;
  CubicSplinePtr CVar3;
  vector<double,_std::allocator<double>_> rvals;
  FuncflParameters funcflParam;
  double local_d0;
  _Vector_base<double,_std::allocator<double>_> local_c8;
  FuncflParameters local_a8;
  
  getFuncflParam(&local_a8,in_RSI);
  local_c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = 0;
  iVar1 = local_a8.nr;
  if (local_a8.nr < 1) {
    iVar1 = 0;
  }
  for (; iVar1 != iVar2; iVar2 = iVar2 + 1) {
    local_d0 = (double)iVar2 * local_a8.dr;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              ((vector<double,_std::allocator<double>_> *)&local_c8,&local_d0);
  }
  std::make_shared<OpenMD::CubicSpline>();
  CubicSpline::addPoints
            ((CubicSpline *)this->at_,(vector<double,_std::allocator<double>_> *)&local_c8,
             &local_a8.Z);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_c8);
  FuncflParameters::~FuncflParameters(&local_a8);
  CVar3.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar3.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (CubicSplinePtr)CVar3.super___shared_ptr<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

CubicSplinePtr EAMAdapter::getZSpline() {
    FuncflParameters funcflParam = getFuncflParam();
    int nr                       = funcflParam.nr;
    RealType dr                  = funcflParam.dr;
    std::vector<RealType> rvals;

    for (int i = 0; i < nr; i++)
      rvals.push_back(RealType(i) * dr);

    CubicSplinePtr cs {std::make_shared<CubicSpline>()};
    cs->addPoints(rvals, funcflParam.Z);
    return cs;
  }